

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QRect __thiscall QMainWindowLayoutState::itemRect(QMainWindowLayoutState *this,QList<int> *path)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QRect QVar4;
  QRect QVar5;
  QArrayDataPointer<int> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0xffffffff00000000;
  iVar1 = *(path->d).ptr;
  if (iVar1 == 1) {
    QList<int>::mid((QList<int> *)&QStack_48,path,1,-1);
    QVar4 = QDockAreaLayout::itemRect(&this->dockAreaLayout,(QList<int> *)&QStack_48);
  }
  else {
    if (iVar1 != 0) {
      uVar3 = 0;
      QVar4 = (QRect)(ZEXT816(0xffffffff) << 0x40);
      goto LAB_004007d4;
    }
    QList<int>::mid((QList<int> *)&QStack_48,path,1,-1);
    QVar4 = QToolBarAreaLayout::itemRect(&this->toolBarAreaLayout,(QList<int> *)&QStack_48);
  }
  uVar3 = QVar4._0_8_ & 0xffffffff00000000;
  uVar2 = QVar4._8_8_ & 0xffffffff00000000;
  QArrayDataPointer<int>::~QArrayDataPointer(&QStack_48);
LAB_004007d4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QVar5._0_8_ = QVar4._0_8_ & 0xffffffff | uVar3;
    QVar5._8_8_ = QVar4._8_8_ & 0xffffffff | uVar2;
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QRect QMainWindowLayoutState::itemRect(const QList<int> &path) const
{
    int i = path.first();

#if QT_CONFIG(toolbar)
    if (i == 0)
        return toolBarAreaLayout.itemRect(path.mid(1));
#endif

#if QT_CONFIG(dockwidget)
    if (i == 1)
        return dockAreaLayout.itemRect(path.mid(1));
#endif // QT_CONFIG(dockwidget)

    return QRect();
}